

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

UBool __thiscall icu_63::TimeZoneFormat::operator==(TimeZoneFormat *this,Format *other)

{
  UBool UVar1;
  int iVar2;
  bool local_2d;
  int local_2c;
  int local_28;
  int32_t i_1;
  int32_t i;
  UBool isEqual;
  TimeZoneFormat *tzfmt;
  Format *other_local;
  TimeZoneFormat *this_local;
  
  UVar1 = Locale::operator==(&this->fLocale,(Locale *)(other + 1));
  local_2d = false;
  if (UVar1 != '\0') {
    UVar1 = UnicodeString::operator==
                      (&this->fGMTPattern,(UnicodeString *)(other[1].validLocale + 0x53));
    local_2d = false;
    if (UVar1 != '\0') {
      UVar1 = UnicodeString::operator==
                        (&this->fGMTZeroFormat,(UnicodeString *)(other[3].actualLocale + 0x48));
      local_2d = false;
      if (UVar1 != '\0') {
        iVar2 = (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[3])
                          (this->fTimeZoneNames,*(undefined8 *)(other[1].validLocale + 0x43));
        local_2d = (char)iVar2 != '\0';
      }
    }
  }
  i_1._3_1_ = local_2d;
  for (local_28 = 0; local_28 < 6 && i_1._3_1_ != '\0'; local_28 = local_28 + 1) {
    i_1._3_1_ = UnicodeString::operator==
                          ((UnicodeString *)(this->fTargetRegion + (long)local_28 * 0x40 + 0x58),
                           (UnicodeString *)(other[1].validLocale + (long)local_28 * 0x40 + 0x93));
  }
  for (local_2c = 0; local_2c < 10 && i_1._3_1_ != '\0'; local_2c = local_2c + 1) {
    i_1._3_1_ = this->fGMTOffsetDigits[local_2c] ==
                *(int *)(other[3].actualLocale + (long)local_2c * 4 + 0x20);
  }
  return i_1._3_1_;
}

Assistant:

UBool
TimeZoneFormat::operator==(const Format& other) const {
    TimeZoneFormat* tzfmt = (TimeZoneFormat*)&other;

    UBool isEqual =
            fLocale == tzfmt->fLocale
            && fGMTPattern == tzfmt->fGMTPattern
            && fGMTZeroFormat == tzfmt->fGMTZeroFormat
            && *fTimeZoneNames == *tzfmt->fTimeZoneNames;

    for (int32_t i = 0; i < UTZFMT_PAT_COUNT && isEqual; i++) {
        isEqual = fGMTOffsetPatterns[i] == tzfmt->fGMTOffsetPatterns[i];
    }
    for (int32_t i = 0; i < 10 && isEqual; i++) {
        isEqual = fGMTOffsetDigits[i] == tzfmt->fGMTOffsetDigits[i];
    }
    // TODO
    // Check fTimeZoneGenericNames. For now,
    // if fTimeZoneNames is same, fTimeZoneGenericNames should
    // be also equivalent.
    return isEqual;
}